

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pragmaVtabConnect(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr
                     )

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  sqlite3_vtab *psVar6;
  undefined8 uVar7;
  sqlite3_vtab *psVar8;
  long lVar9;
  char cVar10;
  char zBuf [200];
  sqlite3_str local_128;
  sqlite3_vtab **local_108;
  char **local_100;
  char local_f8 [200];
  
  local_128.zText = local_f8;
  local_128.db = (sqlite3 *)0x0;
  local_128.nAlloc = 200;
  local_128.mxAlloc = 0;
  local_128.nChar = 0;
  local_128.accError = '\0';
  local_128.printfFlags = '\0';
  local_100 = pzErr;
  sqlite3_str_append(&local_128,"CREATE TABLE x",0xe);
  if (*(char *)((long)pAux + 0xb) == '\0') {
    sqlite3_str_appendf(&local_128,"(\"%s\"",*pAux);
    lVar9 = 1;
  }
  else {
    bVar1 = *(byte *)((long)pAux + 10);
    uVar7 = 0x28;
    lVar9 = 0;
    local_108 = ppVtab;
    do {
      sqlite3_str_appendf(&local_128,"%c\"%s\"",uVar7,pragCName[lVar9 + (ulong)bVar1]);
      lVar9 = lVar9 + 1;
      uVar7 = 0x2c;
      ppVtab = local_108;
    } while ((uint)lVar9 < (uint)*(byte *)((long)pAux + 0xb));
  }
  bVar1 = *(byte *)((long)pAux + 9);
  cVar10 = (bVar1 & 0x20) != 0;
  if ((bool)cVar10) {
    sqlite3_str_append(&local_128,",arg HIDDEN",0xb);
    bVar1 = *(byte *)((long)pAux + 9);
  }
  if (0x3f < bVar1) {
    sqlite3_str_append(&local_128,",schema HIDDEN",0xe);
    cVar10 = cVar10 + '\x01';
  }
  uVar4 = (ulong)local_128.nChar;
  if (local_128.nChar + 1 < local_128.nAlloc) {
    local_128.nChar = local_128.nChar + 1;
    local_128.zText[uVar4] = ')';
  }
  else {
    enlargeAndAppend(&local_128,")",1);
  }
  sqlite3StrAccumFinish(&local_128);
  iVar2 = sqlite3_declare_vtab(db,local_f8);
  if (iVar2 == 0) {
    iVar3 = sqlite3_initialize();
    iVar2 = 7;
    if (iVar3 == 0) {
      psVar6 = (sqlite3_vtab *)sqlite3Malloc(0x30);
      psVar8 = (sqlite3_vtab *)0x0;
      if (psVar6 != (sqlite3_vtab *)0x0) {
        *(undefined8 *)&psVar6[1].nRef = 0;
        psVar6[1].zErrMsg = (char *)0x0;
        psVar6->zErrMsg = (char *)0x0;
        psVar6[1].pModule = (sqlite3_module *)0x0;
        psVar6->pModule = (sqlite3_module *)0x0;
        *(undefined8 *)&psVar6->nRef = 0;
        *(void **)&psVar6[1].nRef = pAux;
        psVar6[1].pModule = (sqlite3_module *)db;
        *(char *)((long)&psVar6[1].zErrMsg + 1) = (char)lVar9;
        *(char *)&psVar6[1].zErrMsg = cVar10;
        iVar2 = 0;
        psVar8 = psVar6;
      }
    }
    else {
      psVar8 = (sqlite3_vtab *)0x0;
    }
  }
  else {
    pcVar5 = sqlite3_errmsg(db);
    pcVar5 = sqlite3_mprintf("%s",pcVar5);
    *local_100 = pcVar5;
    psVar8 = (sqlite3_vtab *)0x0;
  }
  *ppVtab = psVar8;
  return iVar2;
}

Assistant:

static int pragmaVtabConnect(
  sqlite3 *db,
  void *pAux,
  int argc, const char *const*argv,
  sqlite3_vtab **ppVtab,
  char **pzErr
){
  const PragmaName *pPragma = (const PragmaName*)pAux;
  PragmaVtab *pTab = 0;
  int rc;
  int i, j;
  char cSep = '(';
  StrAccum acc;
  char zBuf[200];

  UNUSED_PARAMETER(argc);
  UNUSED_PARAMETER(argv);
  sqlite3StrAccumInit(&acc, 0, zBuf, sizeof(zBuf), 0);
  sqlite3_str_appendall(&acc, "CREATE TABLE x");
  for(i=0, j=pPragma->iPragCName; i<pPragma->nPragCName; i++, j++){
    sqlite3_str_appendf(&acc, "%c\"%s\"", cSep, pragCName[j]);
    cSep = ',';
  }
  if( i==0 ){
    sqlite3_str_appendf(&acc, "(\"%s\"", pPragma->zName);
    i++;
  }
  j = 0;
  if( pPragma->mPragFlg & PragFlg_Result1 ){
    sqlite3_str_appendall(&acc, ",arg HIDDEN");
    j++;
  }
  if( pPragma->mPragFlg & (PragFlg_SchemaOpt|PragFlg_SchemaReq) ){
    sqlite3_str_appendall(&acc, ",schema HIDDEN");
    j++;
  }
  sqlite3_str_append(&acc, ")", 1);
  sqlite3StrAccumFinish(&acc);
  assert( strlen(zBuf) < sizeof(zBuf)-1 );
  rc = sqlite3_declare_vtab(db, zBuf);
  if( rc==SQLITE_OK ){
    pTab = (PragmaVtab*)sqlite3_malloc(sizeof(PragmaVtab));
    if( pTab==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memset(pTab, 0, sizeof(PragmaVtab));
      pTab->pName = pPragma;
      pTab->db = db;
      pTab->iHidden = i;
      pTab->nHidden = j;
    }
  }else{
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
  }

  *ppVtab = (sqlite3_vtab*)pTab;
  return rc;
}